

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  iterator iVar1;
  TestError *pTVar2;
  long lVar3;
  allocator<char> local_391;
  allocator<char> local_390;
  allocator<char> local_38f;
  allocator<char> local_38e;
  allocator<char> local_38d;
  allocator<char> local_38c;
  allocator<char> local_38b;
  allocator<char> local_38a;
  allocator<char> local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *local_378;
  ulong local_370;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string array_initializers [4];
  string invalid_size_declarations [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_50;
  
  local_378 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)invalid_size_declarations,"[2][2][2][]",(allocator<char> *)array_initializers
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 1),"[2][2][][2]",
             (allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 2),"[2][][2][2]",(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 3),"[][2][2][2]",(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 4),"[2][2][][]",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 5),"[2][][2][]",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 6),"[][2][2][]",&local_389);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 7),"[2][][][2]",&local_38a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 8),"[][2][][2]",&local_38b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 9),"[][][2][2]",&local_38c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 10),"[2][][][]",&local_38d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xb),"[][2][][]",&local_38e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xc),"[][][2][]",&local_38f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xd),"[][][][2]",&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(invalid_size_declarations + 0xe),"[][][][]",&local_391);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)array_initializers,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 1),
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 2),
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,(allocator<char> *)&local_338);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,(allocator<char> *)&local_2f8);
  lVar3 = 0;
  do {
    local_370 = (ulong)tested_shader_type;
    if (lVar3 == 4) {
      iVar1 = std::
              _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
              ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                      *)supported_variable_types_map,test_shader_compilation::var_types_set_gl);
      if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Type not found.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c7a);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_380 = array_initializers;
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &iVar1._M_node[1]._M_parent;
      std::__cxx11::string::assign((char *)&shader_source);
      std::operator+(&local_2d8,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &iVar1._M_node[1]._M_parent);
      std::operator+(&local_2f8,&local_2d8,invalid_size_declarations);
      std::operator+(&local_338,&local_2f8," my_variable = ");
      std::operator+(&local_318,&local_338,local_380);
      std::__cxx11::string::append((string *)&shader_source);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::operator+(&local_338,local_388,invalid_size_declarations);
      std::operator+(&local_318,&local_338," my_variable = ");
      std::operator+(&bStack_50,&local_318,local_380);
      std::__cxx11::string::~string((string *)&bStack_50);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::append((string *)&shader_source);
      if (tested_shader_type < SHADER_TYPE_LAST) {
        (*(code *)(&DAT_01722eb4 + *(int *)(&DAT_01722eb4 + local_370 * 4)))();
        return;
      }
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c72);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = std::
            _Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
            ::find((_Rb_tree<glcts::test_var_type,_std::pair<const_glcts::test_var_type,_glcts::var_descriptor>,_std::_Select1st<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                    *)supported_variable_types_map,test_shader_compilation::var_types_set_gl + lVar3
                  );
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lVar3;
    if (iVar1._M_node == (_Base_ptr)(supported_variable_types_map + 8)) {
      pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar2,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c52);
      __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &iVar1._M_node[1]._M_parent;
    for (lVar3 = 0; lVar3 != 0x1e0; lVar3 = lVar3 + 0x20) {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&shader_source);
      std::operator+(&local_2f8,"    ",local_380);
      std::operator+(&local_338,&local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&invalid_size_declarations[0]._M_dataplus._M_p + lVar3));
      std::operator+(&local_318,&local_338," my_variable;\n");
      std::__cxx11::string::append((string *)&shader_source);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::append((string *)&shader_source);
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar2 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar2,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar2,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      switch((long)&switchD_00b9fd36::switchdataD_01722e84 +
             (long)(int)(&switchD_00b9fd36::switchdataD_01722e84)[local_370]) {
      case 0xb9fd38:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case 0xb9fd49:
      case 0xb9fd50:
        std::__cxx11::string::append((string *)&shader_source);
      }
      std::__cxx11::string::append((string *)&shader_source);
      if (lVar3 == 0x60) {
        (*(code *)(&DAT_01722e9c + *(int *)(&DAT_01722e9c + local_370 * 4)))
                  (&DAT_01722e9c + *(int *)(&DAT_01722e9c + local_370 * 4),empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_);
        return;
      }
      (*(local_378->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(local_378,(ulong)tested_shader_type,&shader_source);
      std::__cxx11::string::~string((string *)&shader_source);
    }
    lVar3 = (long)local_388 + 1;
  } while( true );
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}